

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

double __thiscall ON_PlaneEquation::MaximumCoefficient(ON_PlaneEquation *this)

{
  double local_18;
  double m;
  ON_PlaneEquation *this_local;
  
  local_18 = ABS(this->x);
  if (local_18 < ABS(this->y)) {
    local_18 = ABS(this->y);
  }
  if (local_18 < ABS(this->z)) {
    local_18 = ABS(this->z);
  }
  if (local_18 < ABS(this->d)) {
    local_18 = ABS(this->d);
  }
  return local_18;
}

Assistant:

double ON_PlaneEquation::MaximumCoefficient() const
{
  double m = fabs(x);
  if (fabs(y) > m)
    m = fabs(y);
  if (fabs(z) > m)
    m = fabs(z);
  if (fabs(d) > m)
    m = fabs(d);
  return m;
}